

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<SynBinaryOpElement,_32U>::SmallArray
          (SmallArray<SynBinaryOpElement,_32U> *this,Allocator *allocator)

{
  SynBinaryOpElement *local_20;
  Allocator *allocator_local;
  SmallArray<SynBinaryOpElement,_32U> *this_local;
  
  local_20 = this->little;
  do {
    SynBinaryOpElement::SynBinaryOpElement(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (SynBinaryOpElement *)&this->allocator);
  this->allocator = allocator;
  this->data = this->little;
  this->max = 0x20;
  this->count = 0;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}